

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::StrictEqual(Var aLeft,Var aRight,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  JavascriptString *aLeft_00;
  JavascriptString *aRight_00;
  RecyclableObject *pRVar7;
  ScriptContext *in_R8;
  Type leftType;
  TypeId TStack_50;
  uint local_38;
  byte local_31;
  BOOL result;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_009975ce;
    *puVar6 = 0;
  }
  bVar2 = TaggedInt::Is(aLeft);
  if (bVar2) {
    leftType = TypeIds_FirstNumberType;
LAB_009972b7:
    if ((aLeft == aRight) && (leftType != TypeIds_Number)) {
      return 1;
    }
  }
  else {
    if ((ulong)aLeft >> 0x32 == 0) {
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_009975ce;
        *puVar6 = 0;
      }
      leftType = ((pRVar7->type).ptr)->typeId;
      if ((0x57 < (int)leftType) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_009975ce;
        *puVar6 = 0;
      }
      goto LAB_009972b7;
    }
    leftType = TypeIds_Number;
  }
  bVar2 = aLeft == aRight;
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_009975ce;
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(aRight);
  local_31 = bVar2;
  if (bVar3) {
    TStack_50 = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)aRight >> 0x32 != 0) {
      TStack_50 = TypeIds_Number;
      goto LAB_00997360;
    }
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_009975ce;
      *puVar6 = 0;
    }
    TStack_50 = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)TStack_50) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_009975ce:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
LAB_00997360:
  if (leftType == TypeIds_String) {
    if (TStack_50 != TypeIds_String) {
      return 0;
    }
    aLeft_00 = UnsafeVarTo<Js::JavascriptString>(aLeft);
    aRight_00 = UnsafeVarTo<Js::JavascriptString>(aRight);
    bVar2 = JavascriptString::Equals(aLeft_00,aRight_00);
  }
  else {
    if (leftType - TypeIds_FirstNumberType < 4) {
      BVar4 = StrictEqualNumberType(aLeft,aRight,leftType,TStack_50,in_R8);
      return BVar4;
    }
    if (leftType != TypeIds_BigInt) {
      if (leftType != TypeIds_GlobalObject) {
        return (uint)local_31;
      }
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
      iVar5 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2f])(pRVar7,aRight,&local_38,requestContext);
      if (iVar5 != 0) {
        return local_38;
      }
      return 0;
    }
    if (TStack_50 != TypeIds_BigInt) {
      return 0;
    }
    bVar2 = JavascriptBigInt::Equals(aLeft,aRight);
  }
  return (uint)bVar2;
}

Assistant:

BOOL JavascriptOperators::StrictEqual(Var aLeft, Var aRight, ScriptContext* requestContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_StrictEqual);
        TypeId rightType, leftType;
        leftType = JavascriptOperators::GetTypeId(aLeft);

        // Because NaN !== NaN, we may not return TRUE when typeId is Number
        if (aLeft == aRight && leftType != TypeIds_Number) return TRUE;

        rightType = JavascriptOperators::GetTypeId(aRight);

        if (leftType == TypeIds_String)
        {
            if (rightType == TypeIds_String)
            {
                return JavascriptString::Equals(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
            }
            return FALSE;
        }
        else if (leftType >= TypeIds_Integer && leftType <= TypeIds_UInt64Number)
        {
            return JavascriptOperators::StrictEqualNumberType(aLeft, aRight, leftType, rightType, requestContext);
        }
        else if (leftType == TypeIds_GlobalObject)
        {
            BOOL result;
            if (UnsafeVarTo<RecyclableObject>(aLeft)->StrictEquals(aRight, &result, requestContext))
            {
                return result;
            }
            return false;
        }
        else if (leftType == TypeIds_BigInt)
        {
            if (rightType == TypeIds_BigInt)
            {
                return JavascriptBigInt::Equals(aLeft, aRight);
            }
            return FALSE;
        }

        return aLeft == aRight;
        JIT_HELPER_END(Op_StrictEqual);
    }